

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigMiterProve(Ivy_FraigMan_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  void *pvVar6;
  Ivy_Obj_t *pIVar7;
  int *piVar8;
  int fVerbose;
  abctime clk;
  int RetValue;
  int i;
  Ivy_Obj_t *pObjNew;
  Ivy_Obj_t *pObj;
  Ivy_FraigMan_t *p_local;
  
  Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p->pManAig->vPos);
    if (iVar2 <= clk._4_4_) {
      return;
    }
    pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vPos,clk._4_4_);
    pIVar5 = Ivy_ObjChild0Equiv(pIVar4);
    if (pIVar5 == p->pManFraig->pConst1) break;
    pIVar7 = Ivy_Not(p->pManFraig->pConst1);
    if (pIVar5 != pIVar7) {
      pIVar7 = Ivy_Regular(pIVar5);
      uVar1 = *(uint *)&pIVar7->field_0x8;
      uVar3 = Ivy_IsComplement(pIVar5);
      if ((uVar1 >> 7 & 1) != uVar3) {
        iVar2 = Ivy_ManPiNum(p->pManFraig);
        pvVar6 = malloc((long)iVar2 << 2);
        p->pManFraig->pData = pvVar6;
        pvVar6 = p->pManFraig->pData;
        iVar2 = Ivy_ManPiNum(p->pManFraig);
        memset(pvVar6,0,(long)iVar2 << 2);
        return;
      }
      pIVar5 = Ivy_Regular(pIVar5);
      iVar2 = Ivy_FraigNodeIsConst(p,pIVar5);
      if (iVar2 == 1) {
        pIVar5 = p->pManFraig->pConst1;
        iVar2 = Ivy_ObjFaninC0(pIVar4);
        pIVar5 = Ivy_NotCond(pIVar5,(uint)((iVar2 != 0 ^ 0xffU) & 1));
        pIVar4 = Ivy_ObjFanin0(pIVar4);
        pIVar4->pEquiv = pIVar5;
      }
      else if (iVar2 != -1) {
        piVar8 = Ivy_FraigCreateModel(p);
        p->pManFraig->pData = piVar8;
        return;
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
  iVar2 = Ivy_ManPiNum(p->pManFraig);
  pvVar6 = malloc((long)iVar2 << 2);
  p->pManFraig->pData = pvVar6;
  pvVar6 = p->pManFraig->pData;
  iVar2 = Ivy_ManPiNum(p->pManFraig);
  memset(pvVar6,0,(long)iVar2 << 2);
  return;
}

Assistant:

void Ivy_FraigMiterProve( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, RetValue;
    abctime clk = Abc_Clock();
    int fVerbose = 0;
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        if ( i && fVerbose )
        {
            ABC_PRT( "Time", Abc_Clock() -clk );
        }
        pObjNew = Ivy_ObjChild0Equiv(pObj);
        // check if the output is constant 1
        if ( pObjNew == p->pManFraig->pConst1 )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is constant 1.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(p->pManFraig->pConst1) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is already constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            continue;
        }
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) cannot be constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
/*
        // check the representative of this node
        pRepr = Ivy_ObjClassNodeRepr(Ivy_ObjFanin0(pObj));
        if ( Ivy_Regular(pRepr) != p->pManAig->pConst1 )
            printf( "Representative is not constant 1.\n" );
        else
            printf( "Representative is constant 1.\n" );
*/
        // try to prove the output constant 0
        RetValue = Ivy_FraigNodeIsConst( p, Ivy_Regular(pObjNew) );
        if ( RetValue == 1 )  // proved equivalent
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) was proved constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // set the constant miter
            Ivy_ObjFanin0(pObj)->pEquiv = Ivy_NotCond( p->pManFraig->pConst1, !Ivy_ObjFaninC0(pObj) );
            continue;
        }
        if ( RetValue == -1 ) // failed
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) has timed out at %d backtracks.  ", i, Ivy_ManPoNum(p->pManAig), p->pParams->nBTLimitMiter );
            continue;
        }
        // proved satisfiable
        if ( fVerbose )
            printf( "Output %2d (out of %2d) was proved NOT a constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
        // create the model
        p->pManFraig->pData = Ivy_FraigCreateModel(p);
        break;
    }
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() -clk );
    }
}